

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O0

uint64_t roaring64_bitmap_maximum(roaring64_bitmap_t *r)

{
  leaf_t *leaf;
  art_iterator_t it;
  undefined1 *c;
  undefined1 local_98 [7];
  _Bool in_stack_ffffffffffffff6f;
  art_t *in_stack_ffffffffffffff70;
  uint64_t local_8;
  
  art_init_iterator(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6f);
  if (in_stack_ffffffffffffff70 == (art_t *)0x0) {
    local_8 = 0;
  }
  else {
    c = local_98;
    container_maximum(c,'\0');
    local_8 = combine_key((uint8_t *)in_stack_ffffffffffffff70,(uint16_t)((ulong)c >> 0x30));
  }
  return local_8;
}

Assistant:

uint64_t roaring64_bitmap_maximum(const roaring64_bitmap_t *r) {
    art_iterator_t it = art_init_iterator(&r->art, /*first=*/false);
    if (it.value == NULL) {
        return 0;
    }
    leaf_t *leaf = (leaf_t *)it.value;
    return combine_key(it.key,
                       container_maximum(leaf->container, leaf->typecode));
}